

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-readdir.c
# Opt level: O1

int run_test_fs_readdir_non_existing_dir(void)

{
  char *__s1;
  int iVar1;
  undefined8 uVar2;
  uv_fs_t *puVar3;
  uv_fs_t *puVar4;
  long lVar5;
  int64_t eval_b;
  int64_t eval_a;
  undefined1 auStack_970 [448];
  uv_fs_t *puStack_7b0;
  long lStack_7a0;
  long lStack_798;
  uv_fs_t *apuStack_790 [56];
  undefined8 auStack_5d0 [56];
  undefined8 auStack_410 [11];
  uv_fs_t *puStack_3b8;
  undefined1 auStack_250 [448];
  uv_fs_t *puStack_90;
  undefined1 auStack_40 [56];
  
  auStack_40._32_8_ = (void *)0x18b975;
  memset(&opendir_req,0xdb,0x1c0);
  auStack_40._32_8_ = (void *)0x18b97a;
  uVar2 = uv_default_loop();
  auStack_40._32_8_ = (void *)0x18b98e;
  iVar1 = uv_fs_opendir(uVar2,&opendir_req,"./non-existing-dir/",0);
  auStack_40._48_8_ = SEXT48(iVar1);
  auStack_40._40_8_ = (void *)0xfffffffffffffffe;
  if ((void *)auStack_40._48_8_ == (void *)0xfffffffffffffffe) {
    auStack_40._48_8_ = SEXT48(opendir_req.fs_type);
    auStack_40._40_8_ = (void *)0x1f;
    if ((void *)auStack_40._48_8_ != (void *)0x1f) goto LAB_0018bb36;
    auStack_40._48_8_ = opendir_req.result;
    auStack_40._40_8_ = (void *)0xfffffffffffffffe;
    if (opendir_req.result != -2) goto LAB_0018bb43;
    if (opendir_req.ptr != (void *)0x0) goto LAB_0018bb50;
    auStack_40._32_8_ = (void *)0x18ba11;
    uv_fs_req_cleanup(&opendir_req);
    auStack_40._32_8_ = (void *)0x18ba23;
    memset(&opendir_req,0xdb,0x1c0);
    auStack_40._32_8_ = (void *)0x18ba28;
    uVar2 = uv_default_loop();
    auStack_40._32_8_ = (void *)0x18ba41;
    iVar1 = uv_fs_opendir(uVar2,&opendir_req,"./non-existing-dir/",non_existing_opendir_cb);
    auStack_40._48_8_ = SEXT48(iVar1);
    auStack_40._40_8_ = (void *)0x0;
    if ((void *)auStack_40._48_8_ != (void *)0x0) goto LAB_0018bb55;
    auStack_40._48_8_ = SEXT48(non_existing_opendir_cb_count);
    auStack_40._40_8_ = (void *)0x0;
    if ((void *)auStack_40._48_8_ != (void *)0x0) goto LAB_0018bb62;
    auStack_40._32_8_ = (void *)0x18ba87;
    uVar2 = uv_default_loop();
    auStack_40._32_8_ = (void *)0x18ba91;
    iVar1 = uv_run(uVar2,0);
    auStack_40._48_8_ = SEXT48(iVar1);
    auStack_40._40_8_ = (void *)0x0;
    if ((void *)auStack_40._48_8_ != (void *)0x0) goto LAB_0018bb6f;
    auStack_40._48_8_ = (void *)0x1;
    auStack_40._40_8_ = SEXT48(non_existing_opendir_cb_count);
    if ((void *)auStack_40._40_8_ != (void *)0x1) goto LAB_0018bb7c;
    auStack_40._32_8_ = (void *)0x18bad7;
    puVar3 = (uv_fs_t *)uv_default_loop();
    auStack_40._32_8_ = (void *)0x18baeb;
    uv_walk(puVar3,close_walk_cb,0);
    auStack_40._32_8_ = (void *)0x18baf5;
    uv_run(puVar3,0);
    auStack_40._48_8_ = (void *)0x0;
    auStack_40._32_8_ = (void *)0x18bb03;
    uVar2 = uv_default_loop();
    auStack_40._32_8_ = (void *)0x18bb0b;
    iVar1 = uv_loop_close(uVar2);
    auStack_40._40_8_ = SEXT48(iVar1);
    if (auStack_40._48_8_ == auStack_40._40_8_) {
      auStack_40._32_8_ = (void *)0x18bb21;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    auStack_40._32_8_ = (void *)0x18bb36;
    run_test_fs_readdir_non_existing_dir_cold_1();
LAB_0018bb36:
    auStack_40._32_8_ = (void *)0x18bb43;
    run_test_fs_readdir_non_existing_dir_cold_2();
LAB_0018bb43:
    auStack_40._32_8_ = (void *)0x18bb50;
    run_test_fs_readdir_non_existing_dir_cold_3();
LAB_0018bb50:
    auStack_40._32_8_ = (void *)0x18bb55;
    run_test_fs_readdir_non_existing_dir_cold_4();
LAB_0018bb55:
    auStack_40._32_8_ = (void *)0x18bb62;
    run_test_fs_readdir_non_existing_dir_cold_5();
LAB_0018bb62:
    auStack_40._32_8_ = (void *)0x18bb6f;
    run_test_fs_readdir_non_existing_dir_cold_6();
LAB_0018bb6f:
    auStack_40._32_8_ = (void *)0x18bb7c;
    run_test_fs_readdir_non_existing_dir_cold_7();
LAB_0018bb7c:
    puVar3 = &opendir_req;
    auStack_40._32_8_ = (void *)0x18bb89;
    run_test_fs_readdir_non_existing_dir_cold_8();
  }
  puVar4 = (uv_fs_t *)(auStack_40 + 0x30);
  auStack_40._32_8_ = non_existing_opendir_cb;
  run_test_fs_readdir_non_existing_dir_cold_9();
  if (puVar4 == &opendir_req) {
    auStack_40._32_8_ = SEXT48(opendir_req.fs_type);
    auStack_40._24_8_ = (void *)0x1f;
    if ((code *)auStack_40._32_8_ != (code *)0x1f) goto LAB_0018bc10;
    auStack_40._32_8_ = opendir_req.result;
    auStack_40._24_8_ = (void *)0xfffffffffffffffe;
    if (opendir_req.result != -2) goto LAB_0018bc1f;
    if (opendir_req.ptr == (void *)0x0) {
      auStack_40._8_8_ = (uv_loop_t *)0x18bc00;
      iVar1 = uv_fs_req_cleanup(&opendir_req);
      non_existing_opendir_cb_count = non_existing_opendir_cb_count + 1;
      return iVar1;
    }
  }
  else {
    auStack_40._8_8_ = (uv_loop_t *)0x18bc10;
    non_existing_opendir_cb_cold_1();
LAB_0018bc10:
    auStack_40._8_8_ = (uv_loop_t *)0x18bc1f;
    non_existing_opendir_cb_cold_2();
LAB_0018bc1f:
    auStack_40._8_8_ = (uv_loop_t *)0x18bc2e;
    non_existing_opendir_cb_cold_3();
  }
  auStack_40._8_8_ = run_test_fs_readdir_file;
  non_existing_opendir_cb_cold_4();
  auStack_40._8_8_ = puVar3;
  memset(&opendir_req,0xdb,0x1c0);
  uVar2 = uv_default_loop();
  iVar1 = uv_fs_opendir(uVar2,&opendir_req,"test/fixtures/empty_file",0);
  auStack_40._0_8_ = SEXT48(iVar1);
  if ((void *)auStack_40._0_8_ == (void *)0xffffffffffffffec) {
    auStack_40._0_8_ = SEXT48(opendir_req.fs_type);
    if ((void *)auStack_40._0_8_ != (void *)0x1f) goto LAB_0018be12;
    auStack_40._0_8_ = opendir_req.result;
    if (opendir_req.result != -0x14) goto LAB_0018be1f;
    if (opendir_req.ptr != (void *)0x0) goto LAB_0018be2c;
    uv_fs_req_cleanup(&opendir_req);
    memset(&opendir_req,0xdb,0x1c0);
    uVar2 = uv_default_loop();
    iVar1 = uv_fs_opendir(uVar2,&opendir_req,"test/fixtures/empty_file",file_opendir_cb);
    auStack_40._0_8_ = SEXT48(iVar1);
    if ((void *)auStack_40._0_8_ != (void *)0x0) goto LAB_0018be31;
    auStack_40._0_8_ = SEXT48(file_opendir_cb_count);
    if ((void *)auStack_40._0_8_ != (void *)0x0) goto LAB_0018be3e;
    uVar2 = uv_default_loop();
    iVar1 = uv_run(uVar2,0);
    auStack_40._0_8_ = SEXT48(iVar1);
    if ((void *)auStack_40._0_8_ != (void *)0x0) goto LAB_0018be4b;
    auStack_40._0_8_ = (void *)0x1;
    if (file_opendir_cb_count != 1) goto LAB_0018be58;
    puVar3 = (uv_fs_t *)uv_default_loop();
    uv_walk(puVar3,close_walk_cb,0);
    uv_run(puVar3,0);
    auStack_40._0_8_ = (void *)0x0;
    uVar2 = uv_default_loop();
    iVar1 = uv_loop_close(uVar2);
    if ((void *)auStack_40._0_8_ == (void *)(long)iVar1) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_fs_readdir_file_cold_1();
LAB_0018be12:
    run_test_fs_readdir_file_cold_2();
LAB_0018be1f:
    run_test_fs_readdir_file_cold_3();
LAB_0018be2c:
    run_test_fs_readdir_file_cold_4();
LAB_0018be31:
    run_test_fs_readdir_file_cold_5();
LAB_0018be3e:
    run_test_fs_readdir_file_cold_6();
LAB_0018be4b:
    run_test_fs_readdir_file_cold_7();
LAB_0018be58:
    puVar3 = &opendir_req;
    run_test_fs_readdir_file_cold_8();
  }
  puVar4 = (uv_fs_t *)auStack_40;
  run_test_fs_readdir_file_cold_9();
  if (puVar4 == &opendir_req) {
    if (opendir_req.fs_type != UV_FS_OPENDIR) goto LAB_0018beec;
    if (opendir_req.result != -0x14) goto LAB_0018befb;
    if (opendir_req.ptr == (void *)0x0) {
      iVar1 = uv_fs_req_cleanup(&opendir_req);
      file_opendir_cb_count = file_opendir_cb_count + 1;
      return iVar1;
    }
  }
  else {
    file_opendir_cb_cold_1();
LAB_0018beec:
    file_opendir_cb_cold_2();
LAB_0018befb:
    file_opendir_cb_cold_3();
  }
  file_opendir_cb_cold_4();
  puStack_7b0 = (uv_fs_t *)0x18bf25;
  puStack_90 = puVar3;
  cleanup_test_files();
  puStack_7b0 = (uv_fs_t *)0x18bf2a;
  uVar2 = uv_default_loop();
  puStack_7b0 = (uv_fs_t *)0x18bf49;
  iVar1 = uv_fs_mkdir(uVar2,auStack_250,"test_dir",0x1ed,0);
  apuStack_790[0] = (uv_fs_t *)(long)iVar1;
  auStack_410[0] = 0;
  if (apuStack_790[0] == (uv_fs_t *)0x0) {
    puStack_7b0 = (uv_fs_t *)0x18bf74;
    uVar2 = uv_default_loop();
    puStack_7b0 = (uv_fs_t *)0x18bf99;
    iVar1 = uv_fs_open(uVar2,auStack_410,"test_dir/file1",0x41,0x180,0);
    puVar4 = puStack_3b8;
    apuStack_790[0] = (uv_fs_t *)(long)iVar1;
    auStack_5d0[0] = 0;
    if (apuStack_790[0] != (uv_fs_t *)0x0) goto LAB_0018c580;
    apuStack_790[0] = puStack_3b8;
    auStack_5d0[0] = 0;
    if ((long)puStack_3b8 < 0) goto LAB_0018c592;
    puStack_7b0 = (uv_fs_t *)0x18bff8;
    uv_fs_req_cleanup(auStack_410);
    puStack_7b0 = (uv_fs_t *)0x18bffd;
    uVar2 = uv_default_loop();
    puStack_7b0 = (uv_fs_t *)0x18c011;
    iVar1 = uv_fs_close(uVar2,auStack_5d0,(ulong)puVar4 & 0xffffffff,0);
    apuStack_790[0] = (uv_fs_t *)(long)iVar1;
    lStack_7a0 = 0;
    if (apuStack_790[0] != (uv_fs_t *)0x0) goto LAB_0018c5a4;
    puStack_7b0 = (uv_fs_t *)0x18c03e;
    uv_fs_req_cleanup(auStack_5d0);
    puStack_7b0 = (uv_fs_t *)0x18c043;
    uVar2 = uv_default_loop();
    puStack_7b0 = (uv_fs_t *)0x18c068;
    iVar1 = uv_fs_open(uVar2,auStack_410,"test_dir/file2",0x41,0x180,0);
    apuStack_790[0] = (uv_fs_t *)(long)iVar1;
    lStack_7a0 = 0;
    if (apuStack_790[0] != (uv_fs_t *)0x0) goto LAB_0018c5b3;
    apuStack_790[0] = puStack_3b8;
    lStack_7a0 = 0;
    puVar4 = puStack_3b8;
    if ((long)puStack_3b8 < 0) goto LAB_0018c5c2;
    puStack_7b0 = (uv_fs_t *)0x18c0bb;
    uv_fs_req_cleanup(auStack_410);
    puStack_7b0 = (uv_fs_t *)0x18c0c0;
    uVar2 = uv_default_loop();
    puStack_7b0 = (uv_fs_t *)0x18c0d4;
    iVar1 = uv_fs_close(uVar2,auStack_5d0,(ulong)puStack_3b8 & 0xffffffff,0);
    apuStack_790[0] = (uv_fs_t *)(long)iVar1;
    lStack_7a0 = 0;
    if (apuStack_790[0] != (uv_fs_t *)0x0) goto LAB_0018c5d1;
    puStack_7b0 = (uv_fs_t *)0x18c101;
    uv_fs_req_cleanup(auStack_5d0);
    puStack_7b0 = (uv_fs_t *)0x18c106;
    uVar2 = uv_default_loop();
    puStack_7b0 = (uv_fs_t *)0x18c125;
    iVar1 = uv_fs_mkdir(uVar2,auStack_250,"test_dir/test_subdir",0x1ed,0);
    apuStack_790[0] = (uv_fs_t *)(long)iVar1;
    lStack_7a0 = 0;
    if (apuStack_790[0] != (uv_fs_t *)0x0) goto LAB_0018c5e0;
    puStack_7b0 = (uv_fs_t *)0x18c152;
    uv_fs_req_cleanup(auStack_250);
    puVar4 = &opendir_req;
    puStack_7b0 = (uv_fs_t *)0x18c16b;
    memset(&opendir_req,0xdb,0x1c0);
    puStack_7b0 = (uv_fs_t *)0x18c170;
    uVar2 = uv_default_loop();
    puStack_7b0 = (uv_fs_t *)0x18c184;
    iVar1 = uv_fs_opendir(uVar2,&opendir_req,"test_dir",0);
    puVar3 = (uv_fs_t *)opendir_req.ptr;
    apuStack_790[0] = (uv_fs_t *)(long)iVar1;
    lStack_7a0 = 0;
    if (apuStack_790[0] != (uv_fs_t *)0x0) goto LAB_0018c5ef;
    apuStack_790[0] = (uv_fs_t *)(long)opendir_req.fs_type;
    lStack_7a0 = 0x1f;
    if (apuStack_790[0] != (uv_fs_t *)0x1f) goto LAB_0018c5fe;
    apuStack_790[0] = (uv_fs_t *)opendir_req.result;
    lStack_7a0 = 0;
    if (opendir_req.result != 0) goto LAB_0018c60d;
    if (opendir_req.ptr == (void *)0x0) goto LAB_0018c61c;
    *(uv_dirent_t **)opendir_req.ptr = dirents;
    *(undefined8 *)((long)puVar3 + 8) = 1;
    puStack_7b0 = (uv_fs_t *)0x18c21c;
    uv_fs_req_cleanup(&opendir_req);
    puStack_7b0 = (uv_fs_t *)0x18c221;
    uVar2 = uv_default_loop();
    lVar5 = 0;
    puStack_7b0 = (uv_fs_t *)0x18c238;
    iVar1 = uv_fs_readdir(uVar2,&readdir_req,puVar3,0);
    if (iVar1 != 0) {
      lVar5 = 0;
      do {
        __s1 = dirents[0].name;
        puStack_7b0 = (uv_fs_t *)0x18c26a;
        iVar1 = strcmp(dirents[0].name,"file1");
        if (iVar1 != 0) {
          puStack_7b0 = (uv_fs_t *)0x18c27d;
          iVar1 = strcmp(__s1,"file2");
          if (iVar1 == 0) goto LAB_0018c294;
          puStack_7b0 = (uv_fs_t *)0x18c28c;
          iVar1 = strcmp(__s1,"test_subdir");
          if (iVar1 == 0) goto LAB_0018c294;
LAB_0018c55a:
          puStack_7b0 = (uv_fs_t *)0x18c55f;
          run_test_fs_readdir_non_empty_dir_cold_10();
LAB_0018c55f:
          puStack_7b0 = (uv_fs_t *)0x18c56e;
          run_test_fs_readdir_non_empty_dir_cold_12();
          goto LAB_0018c56e;
        }
LAB_0018c294:
        puStack_7b0 = (uv_fs_t *)0x18c29f;
        iVar1 = strcmp(__s1,"test_subdir");
        if (iVar1 == 0) {
          apuStack_790[0] = (uv_fs_t *)(ulong)dirents[0].type;
          lStack_7a0 = 2;
          if (apuStack_790[0] == (uv_fs_t *)0x2) goto LAB_0018c2ec;
          goto LAB_0018c55f;
        }
        apuStack_790[0] = (uv_fs_t *)(ulong)dirents[0].type;
        lStack_7a0 = 1;
        if (apuStack_790[0] != (uv_fs_t *)0x1) {
          puStack_7b0 = (uv_fs_t *)0x18c55a;
          run_test_fs_readdir_non_empty_dir_cold_11();
          goto LAB_0018c55a;
        }
LAB_0018c2ec:
        apuStack_790[0] = (uv_fs_t *)(ulong)dirents[0].type;
        puStack_7b0 = (uv_fs_t *)0x18c2f4;
        uv_fs_req_cleanup(&readdir_req);
        lVar5 = lVar5 + 1;
        puStack_7b0 = (uv_fs_t *)0x18c2fc;
        uVar2 = uv_default_loop();
        puStack_7b0 = (uv_fs_t *)0x18c30c;
        iVar1 = uv_fs_readdir(uVar2,&readdir_req,puVar3,0);
      } while (iVar1 != 0);
    }
    apuStack_790[0] = (uv_fs_t *)0x3;
    lStack_7a0 = lVar5;
    if (lVar5 != 3) goto LAB_0018c621;
    puStack_7b0 = (uv_fs_t *)0x18c33e;
    uv_fs_req_cleanup(&readdir_req);
    puStack_7b0 = (uv_fs_t *)0x18c357;
    memset(&closedir_req,0xdb,0x1c0);
    puStack_7b0 = (uv_fs_t *)0x18c35c;
    uVar2 = uv_default_loop();
    puStack_7b0 = (uv_fs_t *)0x18c36c;
    uv_fs_closedir(uVar2,&closedir_req,puVar3,0);
    apuStack_790[0] = (uv_fs_t *)closedir_req.result;
    lStack_7a0 = 0;
    if (closedir_req.result != 0) goto LAB_0018c630;
    puStack_7b0 = (uv_fs_t *)0x18c39d;
    uv_fs_req_cleanup(&closedir_req);
    puVar3 = &opendir_req;
    puStack_7b0 = (uv_fs_t *)0x18c3b6;
    memset(&opendir_req,0xdb,0x1c0);
    puStack_7b0 = (uv_fs_t *)0x18c3bb;
    uVar2 = uv_default_loop();
    puStack_7b0 = (uv_fs_t *)0x18c3d4;
    iVar1 = uv_fs_opendir(uVar2,&opendir_req,"test_dir",non_empty_opendir_cb);
    apuStack_790[0] = (uv_fs_t *)(long)iVar1;
    lStack_7a0 = 0;
    if (apuStack_790[0] != (uv_fs_t *)0x0) goto LAB_0018c63f;
    apuStack_790[0] = (uv_fs_t *)(long)non_empty_opendir_cb_count;
    lStack_7a0 = 0;
    if (apuStack_790[0] != (uv_fs_t *)0x0) goto LAB_0018c64e;
    apuStack_790[0] = (uv_fs_t *)(long)non_empty_closedir_cb_count;
    lStack_7a0 = 0;
    if (apuStack_790[0] != (uv_fs_t *)0x0) goto LAB_0018c65d;
    puStack_7b0 = (uv_fs_t *)0x18c443;
    uVar2 = uv_default_loop();
    puStack_7b0 = (uv_fs_t *)0x18c44d;
    iVar1 = uv_run(uVar2,0);
    apuStack_790[0] = (uv_fs_t *)(long)iVar1;
    lStack_7a0 = 0;
    if (apuStack_790[0] != (uv_fs_t *)0x0) goto LAB_0018c66c;
    apuStack_790[0] = (uv_fs_t *)0x1;
    lStack_7a0 = (long)non_empty_opendir_cb_count;
    if (lStack_7a0 != 1) goto LAB_0018c67b;
    apuStack_790[0] = (uv_fs_t *)0x1;
    lStack_7a0 = (long)non_empty_closedir_cb_count;
    if (lStack_7a0 == 1) {
      puStack_7b0 = (uv_fs_t *)0x18c4bc;
      uVar2 = uv_default_loop();
      puStack_7b0 = (uv_fs_t *)0x18c4d5;
      uv_fs_rmdir(uVar2,apuStack_790,"test_subdir",0);
      puStack_7b0 = (uv_fs_t *)0x18c4dd;
      uv_fs_req_cleanup(apuStack_790);
      puStack_7b0 = (uv_fs_t *)0x18c4e2;
      cleanup_test_files();
      puStack_7b0 = (uv_fs_t *)0x18c4e7;
      puVar3 = (uv_fs_t *)uv_default_loop();
      puStack_7b0 = (uv_fs_t *)0x18c4fb;
      uv_walk(puVar3,close_walk_cb,0);
      puStack_7b0 = (uv_fs_t *)0x18c505;
      uv_run(puVar3,0);
      lStack_7a0 = 0;
      puStack_7b0 = (uv_fs_t *)0x18c513;
      uVar2 = uv_default_loop();
      puStack_7b0 = (uv_fs_t *)0x18c51b;
      iVar1 = uv_loop_close(uVar2);
      lStack_798 = (long)iVar1;
      if (lStack_7a0 == lStack_798) {
        puStack_7b0 = (uv_fs_t *)0x18c537;
        uv_library_shutdown();
        return 0;
      }
      goto LAB_0018c699;
    }
  }
  else {
LAB_0018c56e:
    puStack_7b0 = (uv_fs_t *)0x18c580;
    run_test_fs_readdir_non_empty_dir_cold_1();
LAB_0018c580:
    puVar4 = puVar3;
    puStack_7b0 = (uv_fs_t *)0x18c592;
    run_test_fs_readdir_non_empty_dir_cold_2();
LAB_0018c592:
    puStack_7b0 = (uv_fs_t *)0x18c5a4;
    run_test_fs_readdir_non_empty_dir_cold_24();
LAB_0018c5a4:
    puStack_7b0 = (uv_fs_t *)0x18c5b3;
    run_test_fs_readdir_non_empty_dir_cold_3();
LAB_0018c5b3:
    puStack_7b0 = (uv_fs_t *)0x18c5c2;
    run_test_fs_readdir_non_empty_dir_cold_4();
LAB_0018c5c2:
    puStack_7b0 = (uv_fs_t *)0x18c5d1;
    run_test_fs_readdir_non_empty_dir_cold_23();
LAB_0018c5d1:
    puStack_7b0 = (uv_fs_t *)0x18c5e0;
    run_test_fs_readdir_non_empty_dir_cold_5();
LAB_0018c5e0:
    puStack_7b0 = (uv_fs_t *)0x18c5ef;
    run_test_fs_readdir_non_empty_dir_cold_6();
LAB_0018c5ef:
    puStack_7b0 = (uv_fs_t *)0x18c5fe;
    run_test_fs_readdir_non_empty_dir_cold_7();
LAB_0018c5fe:
    puStack_7b0 = (uv_fs_t *)0x18c60d;
    run_test_fs_readdir_non_empty_dir_cold_8();
LAB_0018c60d:
    puVar3 = puVar4;
    puStack_7b0 = (uv_fs_t *)0x18c61c;
    run_test_fs_readdir_non_empty_dir_cold_9();
LAB_0018c61c:
    puStack_7b0 = (uv_fs_t *)0x18c621;
    run_test_fs_readdir_non_empty_dir_cold_22();
LAB_0018c621:
    puStack_7b0 = (uv_fs_t *)0x18c630;
    run_test_fs_readdir_non_empty_dir_cold_13();
LAB_0018c630:
    puStack_7b0 = (uv_fs_t *)0x18c63f;
    run_test_fs_readdir_non_empty_dir_cold_14();
LAB_0018c63f:
    puStack_7b0 = (uv_fs_t *)0x18c64e;
    run_test_fs_readdir_non_empty_dir_cold_15();
LAB_0018c64e:
    puStack_7b0 = (uv_fs_t *)0x18c65d;
    run_test_fs_readdir_non_empty_dir_cold_16();
LAB_0018c65d:
    puStack_7b0 = (uv_fs_t *)0x18c66c;
    run_test_fs_readdir_non_empty_dir_cold_17();
LAB_0018c66c:
    puStack_7b0 = (uv_fs_t *)0x18c67b;
    run_test_fs_readdir_non_empty_dir_cold_18();
LAB_0018c67b:
    puStack_7b0 = (uv_fs_t *)0x18c68a;
    run_test_fs_readdir_non_empty_dir_cold_19();
  }
  puStack_7b0 = (uv_fs_t *)0x18c699;
  run_test_fs_readdir_non_empty_dir_cold_20();
LAB_0018c699:
  puStack_7b0 = (uv_fs_t *)cleanup_test_files;
  run_test_fs_readdir_non_empty_dir_cold_21();
  puStack_7b0 = puVar3;
  uv_fs_unlink(0,auStack_970,"test_dir/file1",0);
  uv_fs_req_cleanup(auStack_970);
  uv_fs_unlink(0,auStack_970,"test_dir/file2",0);
  uv_fs_req_cleanup(auStack_970);
  uv_fs_rmdir(0,auStack_970,"test_dir/test_subdir",0);
  uv_fs_req_cleanup(auStack_970);
  uv_fs_rmdir(0,auStack_970,"test_dir",0);
  iVar1 = uv_fs_req_cleanup(auStack_970);
  return iVar1;
}

Assistant:

TEST_IMPL(fs_readdir_non_existing_dir) {
  const char* path;
  int r;

  path = "./non-existing-dir/";

  /* Fill the req to ensure that required fields are cleaned up. */
  memset(&opendir_req, 0xdb, sizeof(opendir_req));

  /* Testing the synchronous flavor. */
  r = uv_fs_opendir(uv_default_loop(), &opendir_req, path, NULL);
  ASSERT_EQ(r, UV_ENOENT);
  ASSERT_EQ(opendir_req.fs_type, UV_FS_OPENDIR);
  ASSERT_EQ(opendir_req.result, UV_ENOENT);
  ASSERT_NULL(opendir_req.ptr);
  uv_fs_req_cleanup(&opendir_req);

  /* Fill the req to ensure that required fields are cleaned up. */
  memset(&opendir_req, 0xdb, sizeof(opendir_req));

  /* Testing the async flavor. */
  r = uv_fs_opendir(uv_default_loop(),
                    &opendir_req,
                    path,
                    non_existing_opendir_cb);
  ASSERT_OK(r);
  ASSERT_OK(non_existing_opendir_cb_count);
  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT_OK(r);
  ASSERT_EQ(1, non_existing_opendir_cb_count);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}